

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

void __thiscall
icu_63::MessagePattern::addPart
          (MessagePattern *this,UMessagePatternPartType type,int32_t index,int32_t length,
          int32_t value,UErrorCode *errorCode)

{
  int iVar1;
  UBool UVar2;
  Part *pPVar3;
  Part *part;
  UErrorCode *errorCode_local;
  int32_t value_local;
  int32_t length_local;
  int32_t index_local;
  UMessagePatternPartType type_local;
  MessagePattern *this_local;
  
  UVar2 = MessagePatternList<icu_63::MessagePattern::Part,_32>::ensureCapacityForOneMore
                    (&this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>,
                     this->partsLength,errorCode);
  if (UVar2 != '\0') {
    iVar1 = this->partsLength;
    this->partsLength = iVar1 + 1;
    pPVar3 = MaybeStackArray<icu_63::MessagePattern::Part,_32>::operator[]
                       ((MaybeStackArray<icu_63::MessagePattern::Part,_32> *)this->partsList,
                        (long)iVar1);
    pPVar3->type = type;
    pPVar3->index = index;
    pPVar3->length = (uint16_t)length;
    pPVar3->value = (int16_t)value;
    pPVar3->limitPartIndex = 0;
  }
  return;
}

Assistant:

void
MessagePattern::addPart(UMessagePatternPartType type, int32_t index, int32_t length,
                        int32_t value, UErrorCode &errorCode) {
    if(partsList->ensureCapacityForOneMore(partsLength, errorCode)) {
        Part &part=partsList->a[partsLength++];
        part.type=type;
        part.index=index;
        part.length=(uint16_t)length;
        part.value=(int16_t)value;
        part.limitPartIndex=0;
    }
}